

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

string_view
slang::ast::SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction)

{
  char *pcVar1;
  string_view sVar2;
  size_t sStack_8;
  
  switch(typeRestriction) {
  case Enum:
    pcVar1 = "enum";
    sStack_8 = 4;
    break;
  case Struct:
    pcVar1 = "struct";
    sStack_8 = 6;
    break;
  case Union:
    pcVar1 = "union";
    goto LAB_0073729f;
  case Class:
    pcVar1 = "class";
LAB_0073729f:
    sStack_8 = 5;
    break;
  case InterfaceClass:
    pcVar1 = "interface class";
    sStack_8 = 0xf;
    break;
  default:
    return (string_view)(ZEXT816(0x88e35c) << 0x40);
  }
  sVar2._M_str = pcVar1;
  sVar2._M_len = sStack_8;
  return sVar2;
}

Assistant:

std::string_view SemanticFacts::getTypeRestrictionText(ForwardTypeRestriction typeRestriction) {
    switch (typeRestriction) {
        case ForwardTypeRestriction::Enum:
            return "enum"sv;
        case ForwardTypeRestriction::Struct:
            return "struct"sv;
        case ForwardTypeRestriction::Union:
            return "union"sv;
        case ForwardTypeRestriction::Class:
            return "class"sv;
        case ForwardTypeRestriction::InterfaceClass:
            return "interface class"sv;
        default:
            return ""sv;
    }
}